

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O3

string * __thiscall
cmGlobalNinjaGenerator::OrderDependsTargetForTarget
          (string *__return_storage_ptr__,cmGlobalNinjaGenerator *this,cmGeneratorTarget *target,
          string *param_2)

{
  string *psVar1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  size_type local_18;
  pointer local_10;
  
  psVar1 = cmGeneratorTarget::GetName_abi_cxx11_(target);
  local_10 = (psVar1->_M_dataplus)._M_p;
  local_18 = psVar1->_M_string_length;
  local_28._M_len = 0x22;
  local_28._M_str = "cmake_object_order_depends_target_";
  views._M_len = 2;
  views._M_array = &local_28;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalNinjaGenerator::OrderDependsTargetForTarget(
  cmGeneratorTarget const* target, const std::string& /*config*/) const
{
  return cmStrCat("cmake_object_order_depends_target_", target->GetName());
}